

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_4,_1>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
           *kernel)

{
  Index IVar1;
  undefined8 local_18;
  Index outer;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
  *kernel_local;
  
  local_18 = 0;
  while( true ) {
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
            ::outerSize(kernel);
    if (IVar1 <= local_18) break;
    copy_using_evaluator_innervec_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_0,_2,_0,_0>
    ::run(kernel,local_18);
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_2,_2>
    ::run(kernel,local_18);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::DstEvaluatorType::XprType DstXprType;
    typedef typename Kernel::PacketType PacketType;

    enum { innerSize = DstXprType::InnerSizeAtCompileTime,
           packetSize =unpacket_traits<PacketType>::size,
           vectorizableSize = (int(innerSize) / int(packetSize)) * int(packetSize),
           size = DstXprType::SizeAtCompileTime };

    for(Index outer = 0; outer < kernel.outerSize(); ++outer)
    {
      copy_using_evaluator_innervec_InnerUnrolling<Kernel, 0, vectorizableSize, 0, 0>::run(kernel, outer);
      copy_using_evaluator_DefaultTraversal_InnerUnrolling<Kernel, vectorizableSize, innerSize>::run(kernel, outer);
    }
  }